

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

double sampleSurfaceNoise(SurfaceNoise *sn,int x,int y,int z)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double d3;
  double yamp;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar4 = sn->xzScale * 684.412;
  dVar13 = sn->yScale * 684.412;
  dVar9 = dVar4 / sn->xzFactor;
  dVar10 = dVar13 / sn->yFactor;
  dVar15 = (double)y;
  dVar7 = 1.0;
  dVar8 = 1.0;
  dVar12 = 0.0;
  dVar14 = 0.0;
  dVar11 = 0.0;
  lVar2 = 0;
  uVar3 = 0;
  do {
    dVar5 = dVar4 * (double)x * dVar8;
    dVar6 = dVar13 * dVar15 * dVar8;
    d3 = dVar4 * (double)z * dVar8;
    yamp = dVar13 * dVar8;
    dVar1 = samplePerlin((PerlinNoise *)(((sn->octmin).octaves)->d + lVar2),dVar5,dVar6,d3,yamp,
                         yamp * dVar15);
    dVar5 = samplePerlin((PerlinNoise *)(((sn->octmax).octaves)->d + lVar2),dVar5,dVar6,d3,yamp,
                         yamp * dVar15);
    if (uVar3 < 8) {
      dVar6 = dVar8 * dVar10;
      dVar6 = samplePerlin((PerlinNoise *)(((sn->octmain).octaves)->d + lVar2),
                           (double)x * dVar9 * dVar8,dVar10 * dVar15 * dVar8,
                           dVar9 * (double)z * dVar8,dVar6,dVar6 * dVar15);
      dVar11 = dVar11 + dVar6 * dVar7;
    }
    dVar12 = dVar12 + dVar7 * dVar5;
    dVar14 = dVar14 + dVar7 * dVar1;
    dVar7 = dVar7 * 2.0;
    dVar8 = dVar8 * 0.5;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x140;
  } while (uVar3 != 0x10);
  dVar7 = dVar11 * 0.05 + 0.5;
  dVar14 = dVar14 * 0.001953125;
  dVar13 = dVar14;
  if ((0.0 < dVar7) && (dVar13 = dVar12 * 0.001953125, dVar7 < 1.0)) {
    dVar13 = dVar7 * (dVar13 - dVar14) + dVar14;
  }
  return dVar13;
}

Assistant:

double sampleSurfaceNoise(const SurfaceNoise *sn, int x, int y, int z)
{
    double xzScale = 684.412 * sn->xzScale;
    double yScale = 684.412 * sn->yScale;
    double xzStep = xzScale / sn->xzFactor;
    double yStep = yScale / sn->yFactor;

    double minNoise = 0;
    double maxNoise = 0;
    double mainNoise = 0;
    double persist = 1.0;
    double contrib = 1.0;
    double dx, dy, dz, sy, ty;
    int i;

    for (i = 0; i < 16; i++)
    {
        dx = maintainPrecision(x * xzScale * persist);
        dy = maintainPrecision(y * yScale  * persist);
        dz = maintainPrecision(z * xzScale * persist);
        sy = yScale * persist;
        ty = y * sy;

        minNoise += samplePerlin(&sn->octmin.octaves[i], dx, dy, dz, sy, ty) * contrib;
        maxNoise += samplePerlin(&sn->octmax.octaves[i], dx, dy, dz, sy, ty) * contrib;

        if (i < 8)
        {
            dx = maintainPrecision(x * xzStep * persist);
            dy = maintainPrecision(y * yStep  * persist);
            dz = maintainPrecision(z * xzStep * persist);
            sy = yStep * persist;
            ty = y * sy;
            mainNoise += samplePerlin(&sn->octmain.octaves[i], dx, dy, dz, sy, ty) * contrib;
        }
        persist *= 0.5;
        contrib *= 2.0;
    }

    return clampedLerp(0.5 + 0.05*mainNoise, minNoise/512.0, maxNoise/512.0);
}